

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

int Iso_ObjHashAdd(Iso_Man_t *p,Iso_Obj_t *pIso)

{
  int iVar1;
  uint uVar2;
  Iso_Obj_t *pIVar3;
  int in_EAX;
  uint Value;
  uint uVar4;
  Iso_Obj_t *pIVar5;
  int *piVar6;
  long lVar7;
  
  lVar7 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 ^ *(int *)(&pIso->field_0x0 + lVar7) *
                    *(int *)((long)If_CluHashKey::BigPrimes + lVar7);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  uVar4 = uVar4 % (uint)p->nBins;
  p->nEntries = p->nEntries + 1;
  iVar1 = p->pBins[(int)uVar4];
  if (-1 < (long)iVar1) {
    uVar2 = p->nObjs;
    if (iVar1 < (int)uVar2) {
      if (iVar1 == 0) {
        piVar6 = p->pBins + (int)uVar4;
LAB_006e86ee:
        pIVar5 = p->pObjs;
        if ((pIso <= pIVar5) || (pIVar5 + uVar2 <= pIso)) goto LAB_006e8737;
        *piVar6 = (int)((ulong)((long)pIso - (long)pIVar5) >> 3) * -0x55555555;
        p->nSingles = p->nSingles + 1;
      }
      else {
        pIVar5 = p->pObjs + iVar1;
        while (pIVar5->FanoutSig != pIso->FanoutSig || *(long *)pIVar5 != *(long *)pIso) {
          uVar4 = pIVar5->iNext;
          if (((long)(int)uVar4 < 0) || (uVar2 <= uVar4)) goto LAB_006e8718;
          if (uVar4 == 0) {
            piVar6 = &pIVar5->iNext;
            goto LAB_006e86ee;
          }
          pIVar5 = p->pObjs + (int)uVar4;
        }
        iVar1 = pIVar5->iClass;
        if (iVar1 == 0) {
          p->nClasses = p->nClasses + 1;
          p->nSingles = p->nSingles + -1;
        }
        pIso->iClass = iVar1;
        pIVar3 = p->pObjs;
        if ((pIso <= pIVar3) || (pIVar3 + uVar2 <= pIso)) {
LAB_006e8737:
          __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                        ,0x12d,"int Iso_ObjId(Iso_Man_t *, Iso_Obj_t *)");
        }
        pIVar5->iClass = (int)((ulong)((long)pIso - (long)pIVar3) >> 3) * -0x55555555;
      }
      return in_EAX;
    }
  }
LAB_006e8718:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
}

Assistant:

static inline int Iso_ObjHashAdd( Iso_Man_t * p, Iso_Obj_t * pIso )
{
    Iso_Obj_t * pThis;
    int * pPlace = p->pBins + Iso_ObjHash( pIso, p->nBins );
    p->nEntries++;
    for ( pThis = Iso_ManObj(p, *pPlace); 
          pThis; pPlace = &pThis->iNext, 
          pThis = Iso_ManObj(p, *pPlace) )
        if ( Iso_ObjCompare( &pThis, &pIso ) == 0 ) // equal signatures
        {
            if ( pThis->iClass == 0 )
            {
                p->nClasses++;
                p->nSingles--;
            }
            // add to the list
            pIso->iClass = pThis->iClass;
            pThis->iClass = Iso_ObjId( p, pIso );
            return 1;
        }
    // create new list
    *pPlace = Iso_ObjId( p, pIso );
    p->nSingles++;
    return 0;
}